

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O2

void __thiscall Fl_Pixmap::set_data(Fl_Pixmap *this,char **p)

{
  int iVar1;
  undefined8 in_RAX;
  int ncolors;
  int height;
  
  if (p != (char **)0x0) {
    _ncolors = in_RAX;
    __isoc99_sscanf(*p,"%*d%d%d",&height,&ncolors);
    iVar1 = 2;
    if (-1 < ncolors) {
      iVar1 = ncolors + 1;
    }
    (this->super_Fl_Image).data_ = p;
    (this->super_Fl_Image).count_ = iVar1 + height;
  }
  return;
}

Assistant:

void Fl_Pixmap::set_data(const char * const * p) {
  int	height,		// Number of lines in image
	ncolors;	// Number of colors in image

  if (p) {
    sscanf(p[0],"%*d%d%d", &height, &ncolors);
    if (ncolors < 0) data(p, height + 2);
    else data(p, height + ncolors + 1);
  }
}